

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O0

int __thiscall
SPP::solveSPP(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  XYZ XVar10;
  XYZ neu;
  XYZ neu_00;
  XYZ station_00;
  XYZ neu_01;
  XYZ neu_02;
  XYZ station_01;
  XYZ obj;
  XYZ obj_00;
  XYZ obj_01;
  ELLIPSOID ellipsoid;
  ELLIPSOID type_00;
  ELLIPSOID type_01;
  ELLIPSOID type_02;
  Vector3d b;
  Vector3d a;
  Vector3d b_00;
  Vector3d a_00;
  undefined4 uVar11;
  undefined1 auVar12 [8];
  int iVar13;
  int col;
  double *pdVar14;
  Obs *pOVar15;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  double dStack_530;
  double local_528;
  double dStack_520;
  double local_518;
  double local_510;
  double dStack_508;
  double local_500;
  undefined1 local_4f8 [8];
  XYZ NEU;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  double dStack_4b8;
  int local_494;
  undefined1 local_490 [4];
  int i_2;
  Vector3d dx;
  double pdop;
  double sigma;
  undefined1 auStack_468 [4];
  int Obsnum;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  MatrixXd v;
  MatrixXd tmp5;
  MatrixXd tmp4;
  MatrixXd tmp3;
  MatrixXd tmp2;
  MatrixXd tmp1;
  MatrixXd B_T;
  int flag;
  double IFpsr_1;
  double A_1;
  double E_1;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double local_310;
  double dStack_308;
  double local_300;
  undefined1 local_2f8 [8];
  XYZ satNEU_1;
  double T_1;
  double n_1;
  double m_1;
  double l_1;
  double distance_1;
  Vector3d SatPos_1;
  undefined1 local_270 [8];
  XYZ fix_1;
  int prn_1;
  double IFpsr;
  double A;
  double E;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1c0;
  double dStack_1b8;
  double local_1b0;
  undefined1 local_1a8 [8];
  XYZ satNEU;
  double T;
  double n;
  double m;
  double l;
  double distance;
  Vector3d SatPos;
  undefined1 local_120 [8];
  XYZ fix;
  undefined1 auStack_100 [4];
  int prn;
  XYZ station;
  double dStack_e0;
  int num;
  double BDSR;
  double GPSR;
  int count;
  undefined1 local_a8 [8];
  MatrixXd w;
  MatrixXd P;
  MatrixXd B;
  undefined1 local_68 [8];
  Vector3d RefPos;
  int local_50;
  int i_1;
  int i;
  int cols;
  int BDSObsNum;
  int GPSObsNum;
  Ephemeris **GPSEph_local;
  Obs **BDSObs_local;
  Obs **GPSObs_local;
  Satellite **BDSPosAndVel_local;
  Satellite **GPSPosAndVel_local;
  SPP *this_local;
  
  cols = 0;
  i = 0;
  i_1 = 5;
  for (local_50 = 0; local_50 < 0x20; local_50 = local_50 + 1) {
    if (((*GPSPosAndVel)[local_50].n != -1.0) || (NAN((*GPSPosAndVel)[local_50].n))) {
      cols = cols + 1;
    }
  }
  for (RefPos.data._4_4_ = 0; RefPos.data._4_4_ < 0x40; RefPos.data._4_4_ = RefPos.data._4_4_ + 1) {
    if (((*BDSPosAndVel)[RefPos.data._4_4_].n != -1.0) ||
       (NAN((*BDSPosAndVel)[RefPos.data._4_4_].n))) {
      i = i + 1;
    }
  }
  (this->result).BDSObsNum = i;
  (this->result).GPSObsNum = cols;
  if ((cols == 0) || (i == 0)) {
    i_1 = 4;
  }
  if ((i == 0) && (cols < 5)) {
    this_local._4_4_ = 1;
  }
  else if ((cols == 0) && (i < 5)) {
    this_local._4_4_ = 1;
  }
  else if (((cols == 0) || (i == 0)) || (4 < cols + i)) {
    Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)local_68);
    Matrix<double,_3,_1>::Zero((Matrix<double,_3,_1> *)local_68);
    Matrix<double,_-1,_-1>::Matrix((Matrix<double,__1,__1> *)&P.data,i + cols,i_1);
    iVar13 = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)&P.data);
    col = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)&P.data);
    Matrix<double,_-1,_-1>::Matrix((Matrix<double,__1,__1> *)&w.data,iVar13,col);
    iVar13 = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)&P.data);
    Matrix<double,_-1,_-1>::Matrix((Matrix<double,__1,__1> *)local_a8,iVar13,1);
    Matrix<double,_-1,_-1>::Zero((Matrix<double,__1,__1> *)&P.data);
    Matrix<double,_-1,_-1>::Zero((Matrix<double,__1,__1> *)&w.data);
    GPSR._4_4_ = 0;
    BDSR = (this->result).GPSR;
    dStack_e0 = (this->result).BDSR;
    while (GPSR._4_4_ < 0xb) {
      station.Z._4_4_ = 0;
      XYZ::XYZ((XYZ *)auStack_100);
      fix.Z._4_4_ = 0;
      while ((fix.Z._4_4_ < 0x20 && (cols != 0))) {
        if (((*GPSPosAndVel)[fix.Z._4_4_].n != -1.0) || (NAN((*GPSPosAndVel)[fix.Z._4_4_].n))) {
          pOVar15 = *GPSObs + fix.Z._4_4_;
          uVar11 = *(undefined4 *)&(pOVar15->ObsTime).field_0x4;
          (this->result).ObsTime.Week = (pOVar15->ObsTime).Week;
          *(undefined4 *)&(this->result).ObsTime.field_0x4 = uVar11;
          (this->result).ObsTime.SOW = (pOVar15->ObsTime).SOW;
          XYZ::XYZ((XYZ *)local_120);
          SatPos.data = (double *)(*GPSPosAndVel)[fix.Z._4_4_].SatPosition.X;
          EarthRotationFix(this,(*GPSPosAndVel)[fix.Z._4_4_].deltat,
                           (*GPSPosAndVel)[fix.Z._4_4_].SatPosition,GPS,(XYZ *)local_120);
          pdVar14 = (double *)(&(this->result).field_0x670 + (long)fix.Z._4_4_ * 0x18);
          *pdVar14 = (double)local_120;
          pdVar14[1] = fix.X;
          pdVar14[2] = fix.Y;
          Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)&distance);
          auVar12 = local_120;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance,0,0);
          dVar4 = fix.X;
          *pdVar14 = (double)auVar12;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance,1,0);
          dVar5 = fix.Y;
          *pdVar14 = dVar4;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance,2,0);
          *pdVar14 = dVar5;
          a_00.data = (double *)RefPos._0_8_;
          a_00.rows = local_68._0_4_;
          a_00.cols = local_68._4_4_;
          b_00.data = (double *)SatPos._0_8_;
          b_00._0_8_ = distance;
          dVar6 = dist(a_00,b_00);
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,0,0);
          dVar4 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance,0,0);
          dVar5 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,1,0);
          dVar9 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance,1,0);
          dVar1 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,2,0);
          dVar2 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance,2,0);
          dVar3 = *pdVar14;
          (this->result).GPSDist[fix.Z._4_4_] = dVar6;
          satNEU.Z = 0.0;
          XYZ::XYZ((XYZ *)local_1a8);
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,0,0);
          _auStack_100 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,1,0);
          station.X = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,2,0);
          local_1b0 = *pdVar14;
          local_1c0 = _auStack_100;
          dStack_1b8 = station.X;
          local_1d8 = (double)local_120;
          dStack_1d0 = fix.X;
          local_1c8 = fix.Y;
          station.Y = local_1b0;
          memcpy(&E,&type,0x30);
          XVar10.Y = dStack_1b8;
          XVar10.X = local_1c0;
          XVar10.Z = local_1b0;
          obj.Y = dStack_1d0;
          obj.X = local_1d8;
          obj.Z = local_1c8;
          type_00.b = (double)uStack_200;
          type_00.a = E;
          type_00.c = (double)local_1f8;
          type_00.alpha = (double)uStack_1f0;
          type_00.e2 = (double)local_1e8;
          type_00.e1_2 = dStack_1e0;
          XYZ2NEU(XVar10,obj,type_00,(XYZ *)local_1a8);
          neu.Y = satNEU.X;
          neu.X = (double)local_1a8;
          neu.Z = satNEU.Y;
          dVar7 = CalculateEA(this,neu);
          neu_00.Y = satNEU.X;
          neu_00.X = (double)local_1a8;
          neu_00.Z = satNEU.Y;
          dVar8 = CalculateAzi(this,neu_00);
          (this->result).GPSelev[fix.Z._4_4_] = dVar7;
          (this->result).GPSAzimuth[fix.Z._4_4_] = dVar8;
          satNEU.Z = Hopefield(dVar7,(this->result).UserPositionBLH.H,15.0,1013.25,0.5);
          if (5000.0 < (this->result).UserPositionBLH.H) {
            satNEU.Z = 0.0;
          }
          dVar7 = (((*GPSPosAndVel)[fix.Z._4_4_].clkdif * 299792458.0 +
                   (((*GPSObs)[fix.Z._4_4_].psr[0] * 2.54572778016316 +
                    -((*GPSObs)[fix.Z._4_4_].psr[1] * 1.5457277801631601)) - dVar6)) - BDSR) -
                  satNEU.Z;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)local_a8,station.Z._4_4_,0);
          *pdVar14 = dVar7;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,0);
          *pdVar14 = (dVar4 - dVar5) / dVar6;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,1);
          *pdVar14 = (dVar9 - dVar1) / dVar6;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,2);
          *pdVar14 = (dVar2 - dVar3) / dVar6;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,3);
          *pdVar14 = 1.0;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&w.data,station.Z._4_4_,station.Z._4_4_);
          *pdVar14 = 1.0;
          station.Z._4_4_ = station.Z._4_4_ + 1;
          Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&distance);
        }
        fix.Z._4_4_ = fix.Z._4_4_ + 1;
      }
      fix_1.Z._4_4_ = 0;
      while ((fix_1.Z._4_4_ < 0x40 && (i != 0))) {
        if (((*BDSPosAndVel)[fix_1.Z._4_4_].n != -1.0) || (NAN((*BDSPosAndVel)[fix_1.Z._4_4_].n))) {
          XYZ::XYZ((XYZ *)local_270);
          SatPos_1.data = (double *)(*BDSPosAndVel)[fix_1.Z._4_4_].SatPosition.X;
          EarthRotationFix(this,(*BDSPosAndVel)[fix_1.Z._4_4_].deltat,
                           (*BDSPosAndVel)[fix_1.Z._4_4_].SatPosition,BDS,(XYZ *)local_270);
          pdVar14 = (double *)(&(this->result).field_0x70 + (long)fix_1.Z._4_4_ * 0x18);
          *pdVar14 = (double)local_270;
          pdVar14[1] = fix_1.X;
          pdVar14[2] = fix_1.Y;
          pOVar15 = *BDSObs + fix_1.Z._4_4_;
          uVar11 = *(undefined4 *)&(pOVar15->ObsTime).field_0x4;
          (this->result).ObsTime.Week = (pOVar15->ObsTime).Week;
          *(undefined4 *)&(this->result).ObsTime.field_0x4 = uVar11;
          (this->result).ObsTime.SOW = (pOVar15->ObsTime).SOW;
          Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)&distance_1);
          auVar12 = local_270;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance_1,0,0);
          dVar4 = fix_1.X;
          *pdVar14 = (double)auVar12;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance_1,1,0);
          dVar5 = fix_1.Y;
          *pdVar14 = dVar4;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance_1,2,0);
          *pdVar14 = dVar5;
          a.data = (double *)RefPos._0_8_;
          a.rows = local_68._0_4_;
          a.cols = local_68._4_4_;
          b.data = (double *)SatPos_1._0_8_;
          b._0_8_ = distance_1;
          dVar6 = dist(a,b);
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,0,0);
          dVar4 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance_1,0,0);
          dVar5 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,1,0);
          dVar9 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance_1,1,0);
          dVar1 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,2,0);
          dVar2 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&distance_1,2,0);
          dVar3 = *pdVar14;
          (this->result).BDSDist[fix_1.Z._4_4_] = dVar6;
          satNEU_1.Z = 0.0;
          XYZ::XYZ((XYZ *)local_2f8);
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,0,0);
          _auStack_100 = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,1,0);
          station.X = *pdVar14;
          pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,2,0);
          local_300 = *pdVar14;
          local_310 = _auStack_100;
          dStack_308 = station.X;
          local_328 = (double)local_270;
          dStack_320 = fix_1.X;
          local_318 = fix_1.Y;
          station.Y = local_300;
          memcpy(&E_1,&type,0x30);
          station_00.Y = dStack_308;
          station_00.X = local_310;
          station_00.Z = local_300;
          obj_00.Y = dStack_320;
          obj_00.X = local_328;
          obj_00.Z = local_318;
          type_01.b = (double)uStack_350;
          type_01.a = E_1;
          type_01.c = (double)local_348;
          type_01.alpha = (double)uStack_340;
          type_01.e2 = (double)local_338;
          type_01.e1_2 = dStack_330;
          XYZ2NEU(station_00,obj_00,type_01,(XYZ *)local_2f8);
          neu_01.Y = satNEU_1.X;
          neu_01.X = (double)local_2f8;
          neu_01.Z = satNEU_1.Y;
          dVar7 = CalculateEA(this,neu_01);
          neu_02.Y = satNEU_1.X;
          neu_02.X = (double)local_2f8;
          neu_02.Z = satNEU_1.Y;
          dVar8 = CalculateAzi(this,neu_02);
          (this->result).BDSelev[fix_1.Z._4_4_] = dVar7;
          (this->result).BDSAzimuth[fix_1.Z._4_4_] = dVar8;
          satNEU_1.Z = Hopefield(dVar7,(this->result).UserPositionBLH.H,15.0,1013.25,0.5);
          if (5000.0 < (this->result).UserPositionBLH.H) {
            satNEU_1.Z = 0.0;
          }
          dVar7 = ((((*BDSPosAndVel)[fix_1.Z._4_4_].clkdif * 299792458.0 +
                    (((*BDSObs)[fix_1.Z._4_4_].psr[0] * 2.943681770145979 +
                     -((*BDSObs)[fix_1.Z._4_4_].psr[1] * 1.943681770145979)) - dVar6)) - dStack_e0)
                  - ((*BDSEph)[fix_1.Z._4_4_].tgd * 7.306023042307046e+26) / 8.278839752039997e+17)
                  - satNEU_1.Z;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)local_a8,station.Z._4_4_,0);
          *pdVar14 = dVar7;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,0);
          *pdVar14 = (dVar4 - dVar5) / dVar6;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,1);
          *pdVar14 = (dVar9 - dVar1) / dVar6;
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,2);
          *pdVar14 = (dVar2 - dVar3) / dVar6;
          if (cols == 0) {
            pdVar14 = Matrix<double,_-1,_-1>::operator()
                                ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,3);
            *pdVar14 = 1.0;
          }
          else {
            pdVar14 = Matrix<double,_-1,_-1>::operator()
                                ((Matrix<double,__1,__1> *)&P.data,station.Z._4_4_,4);
            *pdVar14 = 1.0;
          }
          pdVar14 = Matrix<double,_-1,_-1>::operator()
                              ((Matrix<double,__1,__1> *)&w.data,station.Z._4_4_,station.Z._4_4_);
          *pdVar14 = 1.0;
          station.Z._4_4_ = station.Z._4_4_ + 1;
          Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&distance_1);
        }
        fix_1.Z._4_4_ = fix_1.Z._4_4_ + 1;
      }
      B_T.data._4_4_ = 0;
      join_0x00000010_0x00000000_ =
           Matrix<double,_-1,_-1>::transpose((Matrix<double,__1,__1> *)&P.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&tmp1.data,(Matrix<double,__1,__1> *)&w.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&tmp2.data,(Matrix<double,__1,__1> *)&P.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,_-1,_-1>::inverse
                     ((Matrix<double,__1,__1> *)&tmp3.data,(int *)((long)&B_T.data + 4));
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&tmp4.data,(Matrix<double,__1,__1> *)&tmp1.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&tmp5.data,(Matrix<double,__1,__1> *)&w.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&v.data,(Matrix<double,__1,__1> *)local_a8);
      if (B_T.data._4_4_ != 0) {
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp1.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp2.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp3.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp4.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp5.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&v.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&w.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)local_a8);
        Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_68);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&P.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp6.data);
        return 5;
      }
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,0,0);
      dVar4 = *pdVar14;
      pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,0,0);
      *pdVar14 = dVar4 + *pdVar14;
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,1,0);
      dVar4 = *pdVar14;
      pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,1,0);
      *pdVar14 = dVar4 + *pdVar14;
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,2,0);
      dVar4 = *pdVar14;
      pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,2,0);
      *pdVar14 = dVar4 + *pdVar14;
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,3,0);
      BDSR = *pdVar14 + BDSR;
      if ((cols == 0) && (i != 0)) {
        pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,3,0);
        dStack_e0 = *pdVar14 + dStack_e0;
      }
      else if ((i != 0) && (cols != 0)) {
        pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,4,0);
        dStack_e0 = *pdVar14 + dStack_e0;
      }
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&P.data,(Matrix<double,__1,__1> *)&tmp6.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,_-1,_-1>::operator+
                     ((Matrix<double,__1,__1> *)&tmp7.data,(Matrix<double,__1,__1> *)local_a8);
      join_0x00000010_0x00000000_ =
           Matrix<double,_-1,_-1>::transpose((Matrix<double,__1,__1> *)&tmp8.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&tmp9.data,(Matrix<double,__1,__1> *)&w.data);
      _auStack_468 = Matrix<double,-1,-1>::operator*
                               ((Matrix<double,_1,_1> *)&tmp10.data,
                                (Matrix<double,__1,__1> *)&tmp8.data);
      sigma._4_4_ = 5;
      if ((cols == 0) || (i == 0)) {
        sigma._4_4_ = 4;
      }
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)auStack_468,0,0);
      dVar9 = sqrt(*pdVar14 / (double)((i + cols) - sigma._4_4_));
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp4.data,0,0);
      dVar4 = *pdVar14;
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp4.data,1,1);
      dVar5 = *pdVar14;
      pdVar14 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp4.data,2,2);
      dx.data = (double *)sqrt(dVar4 + dVar5 + *pdVar14);
      (this->result).UserPositionSigma = dVar9;
      (this->result).PDop = (double)dx.data;
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp7.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp8.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp9.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp10.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)auStack_468);
      Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)local_490);
      for (local_494 = 0; iVar13 = Matrix<double,_3,_1>::row((Matrix<double,_3,_1> *)local_490),
          local_494 < iVar13; local_494 = local_494 + 1) {
        pdVar14 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&tmp6.data,local_494,0);
        dVar4 = *pdVar14;
        pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_490,local_494,0);
        *pdVar14 = dVar4;
      }
      dVar4 = Matrix<double,_3,_1>::norm((Matrix<double,_3,_1> *)local_490);
      if (dVar4 < 1e-05) {
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp1.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp2.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp3.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp4.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp5.data);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&v.data);
        Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_490);
        Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp6.data);
        break;
      }
      GPSR._4_4_ = GPSR._4_4_ + 1;
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp1.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp2.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp3.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp4.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp5.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&v.data);
      Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_490);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp6.data);
    }
    (this->result).GPSR = BDSR;
    (this->result).BDSR = dStack_e0;
    pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,0,0);
    (this->result).UserPositionXYZ.X = *pdVar14;
    pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,1,0);
    (this->result).UserPositionXYZ.Y = *pdVar14;
    pdVar14 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_68,2,0);
    (this->result).UserPositionXYZ.Z = *pdVar14;
    XVar10 = (this->result).UserPositionXYZ;
    memcpy(&NEU.Z,&type,0x30);
    ellipsoid.b = (double)uStack_4d8;
    ellipsoid.a = NEU.Z;
    ellipsoid.c = (double)local_4d0;
    ellipsoid.alpha = (double)uStack_4c8;
    ellipsoid.e2 = (double)local_4c0;
    ellipsoid.e1_2 = dStack_4b8;
    XYZ2BLH(XVar10,ellipsoid,&(this->result).UserPositionBLH);
    XYZ::XYZ((XYZ *)local_4f8);
    local_510 = (this->result).UserRefPositionXYZ.X;
    dStack_508 = (this->result).UserRefPositionXYZ.Y;
    local_500 = (this->result).UserRefPositionXYZ.Z;
    local_528 = (this->result).UserPositionXYZ.X;
    dStack_520 = (this->result).UserPositionXYZ.Y;
    local_518 = (this->result).UserPositionXYZ.Z;
    memcpy(&local_558,&type,0x30);
    station_01.Y = dStack_508;
    station_01.X = local_510;
    station_01.Z = local_500;
    obj_01.Y = dStack_520;
    obj_01.X = local_528;
    obj_01.Z = local_518;
    type_02.b = (double)uStack_550;
    type_02.a = (double)local_558;
    type_02.c = (double)local_548;
    type_02.alpha = (double)uStack_540;
    type_02.e2 = (double)local_538;
    type_02.e1_2 = dStack_530;
    XYZ2NEU(station_01,obj_01,type_02,(XYZ *)local_4f8);
    (this->result).diffNeu.X = (double)local_4f8;
    (this->result).diffNeu.Y = NEU.X;
    (this->result).diffNeu.Z = NEU.Y;
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&w.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)local_a8);
    Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_68);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&P.data);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int SPP::solveSPP(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
                  Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
                  Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 5;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1)
            BDSObsNum ++;

    this->result.BDSObsNum = BDSObsNum;
    this->result.GPSObsNum = GPSObsNum;

    if(GPSObsNum == 0 || BDSObsNum == 0)
        cols = 4;
    if(BDSObsNum ==0 && GPSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum == 0 && BDSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum != 0 && BDSObsNum != 0 && GPSObsNum + BDSObsNum < 5)
        return NOT_ENOUGH_OBS;
    
    // 测站位置
    Vector3d RefPos;
    RefPos.Zero();
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    B.Zero();
    P.Zero();
    int count = 0;
    double GPSR = this->result.GPSR, BDSR = this->result.BDSR;
    
    while (count <= 10)
    {
        int num = 0;
        XYZ station;
        for(int prn = 0; prn < MAXGPSSRN; ++prn)
        {
            if(GPSObsNum == 0)
                break;
            if(GPSPosAndVel[prn].n == -1){
                continue;
            }
            this->result.ObsTime = GPSObs[prn].ObsTime;

            // 地球自转改正
            XYZ fix;
            EarthRotationFix(GPSPosAndVel[prn].deltat, GPSPosAndVel[prn].SatPosition, GPS, fix);
            this->result.GPSPosi[prn] = fix;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.GPSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);

            this->result.GPSelev[prn] = E;
            this->result.GPSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = GPSL1 * GPSL1 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[0] - 
                           GPSL2 * GPSL2 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[1];
            // w矩阵
            w(num, 0) = IFpsr - distance + GPSPosAndVel[prn].clkdif * LIGHTSPEED - GPSR - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            B(num, 3) = 1;

            P(num, num) = 1.0;// / pow(GPSObs[prn].psr_sigma[0] + GPSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        // BDS
        for(int prn = 0; prn < MAXBDSSRN; ++prn)
        {
            if(BDSObsNum == 0)
                break;
            if(BDSPosAndVel[prn].n == -1){
                continue;
            }
            // 几何距离
            XYZ fix;
            EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatPosition, BDS, fix);
            this->result.BDSPosi[prn] = fix;
            this->result.ObsTime = BDSObs[prn].ObsTime;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.BDSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);
            this->result.BDSelev[prn] = E;
            this->result.BDSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = BDSB1 * BDSB1 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[0] - 
                           BDSB3 * BDSB3 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[1];
            
            // w矩阵
            w(num, 0) = IFpsr - distance + BDSPosAndVel[prn].clkdif * LIGHTSPEED - BDSR -
                        LIGHTSPEED * BDSB1 * BDSB1 * BDSEph[prn].tgd / ((BDSB1 * BDSB1 - BDSB3 * BDSB3)) - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            if(GPSObsNum == 0)
                B(num, 3) = 1;
            else
                B(num, 4) = 1;

            P(num, num) = 1.0;// / pow(BDSObs[prn].psr_sigma[0] + BDSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        int flag = 0;
        MatrixXd B_T = B.transpose();
        MatrixXd tmp1 = B_T * P;
        MatrixXd tmp2 = tmp1 * B;
        MatrixXd tmp3 = tmp2.inverse(flag);
        MatrixXd tmp4 = tmp3 * B_T;
        MatrixXd tmp5 = tmp4 * P;
        MatrixXd v = tmp5 * w;

        if(flag != 0){
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            P.deleteMatrix();
            w.deleteMatrix();
            RefPos.deleteMatrix();
            B.deleteMatrix();
            v.deleteMatrix();
            return NOT_INVERTIBLE;
        }
        RefPos(0, 0) += v(0, 0);
        RefPos(1, 0) += v(1, 0);
        RefPos(2, 0) += v(2, 0);
        GPSR += v(3, 0);
        if(GPSObsNum == 0 && BDSObsNum != 0)
            BDSR += v(3, 0);
        else if(BDSObsNum != 0 && GPSObsNum != 0)
            BDSR += v(4, 0);

        MatrixXd tmp6 = B * v;
        MatrixXd tmp7 = tmp6 + w;
        MatrixXd tmp8 = tmp7.transpose();
        MatrixXd tmp9 = tmp8 * P;
        MatrixXd tmp10 = tmp9 * tmp7;

        int Obsnum = 5;
        if(GPSObsNum ==0 || BDSObsNum ==0)
            Obsnum = 4;
        double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
        double pdop = sqrt(tmp3(0, 0) + tmp3(1, 1) + tmp3(2, 2));

        result.UserPositionSigma = sigma;
        result.PDop = pdop;
        tmp6.deleteMatrix();
        tmp7.deleteMatrix();
        tmp8.deleteMatrix();
        tmp9.deleteMatrix();
        tmp10.deleteMatrix();

        Vector3d dx;
        for(int i = 0; i < dx.row(); i++)
            dx(i, 0) = v(i, 0);
        if(dx.norm() < 1e-5)
        {
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            dx.deleteMatrix();
            v.deleteMatrix();
            break;        
        }
        count ++;

        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        dx.deleteMatrix();
        v.deleteMatrix();
    }
    this->result.GPSR = GPSR;
    this->result.BDSR = BDSR;
    this->result.UserPositionXYZ.X = RefPos(0, 0);
    this->result.UserPositionXYZ.Y = RefPos(1, 0);
    this->result.UserPositionXYZ.Z = RefPos(2, 0);
    XYZ2BLH(result.UserPositionXYZ, type, result.UserPositionBLH);
    XYZ NEU;
    XYZ2NEU(result.UserRefPositionXYZ, result.UserPositionXYZ, type, NEU);
    result.diffNeu = NEU;

    P.deleteMatrix();
    w.deleteMatrix();
    RefPos.deleteMatrix();
    B.deleteMatrix();
    return 0;
}